

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O3

hash_state *
llvm::hashing::detail::hash_state::create(hash_state *__return_storage_ptr__,char *s,uint64_t seed)

{
  ulong uVar1;
  ulong uVar2;
  
  __return_storage_ptr__->h0 = 0;
  __return_storage_ptr__->h1 = seed;
  uVar1 = seed ^ 0xb492b66fbe98f273;
  uVar2 = (uVar1 * -0x622015f714c7d297 ^ 0xb492b66fbe98f273 ^ uVar1 * -0x622015f714c7d297 >> 0x2f) *
          -0x622015f714c7d297;
  __return_storage_ptr__->h2 = (uVar2 >> 0x2f ^ uVar2) * -0x622015f714c7d297;
  __return_storage_ptr__->h3 = uVar1 << 0xf | uVar1 >> 0x31;
  __return_storage_ptr__->h4 = seed * -0x4b6d499041670d8d;
  uVar1 = seed >> 0x2f ^ seed;
  __return_storage_ptr__->h5 = uVar1;
  uVar1 = (uVar1 ^ seed * -0x4b6d499041670d8d) * -0x622015f714c7d297 ^ seed;
  uVar1 = (uVar1 >> 0x2f ^ uVar1) * -0x622015f714c7d297;
  __return_storage_ptr__->h6 = (uVar1 >> 0x2f ^ uVar1) * -0x622015f714c7d297;
  mix(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

static hash_state create(const char *s, uint64_t seed) {
    hash_state state = {
      0, seed, hash_16_bytes(seed, k1), rotate(seed ^ k1, 49),
      seed * k1, shift_mix(seed), 0 };
    state.h6 = hash_16_bytes(state.h4, state.h5);
    state.mix(s);
    return state;
  }